

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O0

Vec_Str_t * Abc_ManReadFile(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  int c;
  Vec_Str_t *vStr;
  FILE *pFile;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n",pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    pFileName_local = (char *)Vec_StrAlloc(100);
    while( true ) {
      iVar1 = fgetc(__stream);
      if (iVar1 == -1) break;
      Vec_StrPush((Vec_Str_t *)pFileName_local,(char)iVar1);
    }
    Vec_StrPush((Vec_Str_t *)pFileName_local,'\0');
    fclose(__stream);
  }
  return (Vec_Str_t *)pFileName_local;
}

Assistant:

Vec_Str_t * Abc_ManReadFile( char * pFileName )
{
    FILE * pFile;
    Vec_Str_t * vStr;
    int c;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    vStr = Vec_StrAlloc( 100 );
    while ( (c = fgetc(pFile)) != EOF )
        Vec_StrPush( vStr, (char)c );
    Vec_StrPush( vStr, '\0' );
    fclose( pFile );
    return vStr;
}